

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O3

void QGraphicsWidget::setTabOrder(QWindow *first,QWindow *second)

{
  long lVar1;
  QWindow *pQVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  QGraphicsScene *pQVar6;
  QGraphicsScene *pQVar7;
  
  if (first == (QWindow *)0x0 && second == (QWindow *)0x0) {
    setTabOrder();
    return;
  }
  if (first == (QWindow *)0x0 || second == (QWindow *)0x0) {
    if (first == (QWindow *)0x0) {
      pQVar6 = QGraphicsItem::scene((QGraphicsItem *)(second + 0x10));
      if (pQVar6 != (QGraphicsScene *)0x0) {
        *(QWindow **)(*(long *)&pQVar6->field_0x8 + 0x1a0) = second;
        return;
      }
      goto LAB_0063d077;
    }
  }
  else {
    pQVar6 = QGraphicsItem::scene((QGraphicsItem *)(first + 0x10));
    pQVar7 = QGraphicsItem::scene((QGraphicsItem *)(second + 0x10));
    if (pQVar6 != pQVar7) {
      setTabOrder();
      return;
    }
  }
  pQVar6 = QGraphicsItem::scene((QGraphicsItem *)(first + 0x10));
  if (pQVar6 != (QGraphicsScene *)0x0) {
    if (second == (QWindow *)0x0) {
      *(undefined8 *)(*(long *)&pQVar6->field_0x8 + 0x1a0) =
           *(undefined8 *)(*(long *)(first + 0x18) + 0x1c0);
      return;
    }
    lVar1 = *(long *)(first + 0x18);
    pQVar2 = *(QWindow **)(lVar1 + 0x1c0);
    if (pQVar2 == second) {
      return;
    }
    lVar3 = *(long *)(second + 0x18);
    lVar4 = *(long *)(lVar3 + 0x1c0);
    lVar5 = *(long *)(lVar3 + 0x1c8);
    *(QWindow **)(*(long *)(pQVar2 + 0x18) + 0x1c8) = second;
    *(QWindow **)(lVar1 + 0x1c0) = second;
    *(QWindow **)(lVar3 + 0x1c0) = pQVar2;
    *(QWindow **)(lVar3 + 0x1c8) = first;
    *(long *)(*(long *)(lVar5 + 0x18) + 0x1c0) = lVar4;
    *(long *)(*(long *)(lVar4 + 0x18) + 0x1c8) = lVar5;
    return;
  }
LAB_0063d077:
  setTabOrder();
  return;
}

Assistant:

void QGraphicsWidget::setTabOrder(QGraphicsWidget *first, QGraphicsWidget *second)
{
    if (!first && !second) {
        qWarning("QGraphicsWidget::setTabOrder(0, 0) is undefined");
        return;
    }
    if ((first && second) && first->scene() != second->scene()) {
        qWarning("QGraphicsWidget::setTabOrder: scenes %p and %p are different",
                 first->scene(), second->scene());
        return;
    }
    QGraphicsScene *scene = first ? first->scene() : second->scene();
    if (!scene) {
        qWarning("QGraphicsWidget::setTabOrder: assigning tab order from/to the"
                 " scene requires the item to be in a scene.");
        return;
    }

    // If either first or second are 0, the scene's tabFocusFirst is updated
    // to point to the first item in the scene's focus chain. Then first or
    // second are set to point to tabFocusFirst.
    QGraphicsScenePrivate *sceneD = scene->d_func();
    if (!first) {
        sceneD->tabFocusFirst = second;
        return;
    }
    if (!second) {
        sceneD->tabFocusFirst = first->d_func()->focusNext;
        return;
    }

    // Both first and second are != 0.
    QGraphicsWidget *firstFocusNext = first->d_func()->focusNext;
    if (firstFocusNext == second) {
        // Nothing to do.
        return;
    }

    // Update the focus chain.
    QGraphicsWidget *secondFocusPrev = second->d_func()->focusPrev;
    QGraphicsWidget *secondFocusNext = second->d_func()->focusNext;
    firstFocusNext->d_func()->focusPrev = second;
    first->d_func()->focusNext = second;
    second->d_func()->focusNext = firstFocusNext;
    second->d_func()->focusPrev = first;
    secondFocusPrev->d_func()->focusNext = secondFocusNext;
    secondFocusNext->d_func()->focusPrev = secondFocusPrev;

    Q_ASSERT(first->d_func()->focusNext->d_func()->focusPrev == first);
    Q_ASSERT(first->d_func()->focusPrev->d_func()->focusNext == first);

    Q_ASSERT(second->d_func()->focusNext->d_func()->focusPrev == second);
    Q_ASSERT(second->d_func()->focusPrev->d_func()->focusNext == second);

}